

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O1

int AF_A_SpawnBishop(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  long *plVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  long lVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *type;
  AActor *mobj;
  AActor *other;
  char *__assertion;
  bool bVar8;
  FName local_44;
  DVector3 local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b8f10;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    plVar2 = (long *)(param->field_0).field_1.a;
    if (plVar2 != (long *)0x0) {
      if (plVar2[1] == 0) {
        lVar5 = (**(code **)*plVar2)(plVar2);
        plVar2[1] = lVar5;
      }
      pPVar7 = (PClass *)plVar2[1];
      bVar8 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar8) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar8 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar8) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b8f10;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b8ee5;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b8f10;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"Bishop",false);
      local_40.X = (double)plVar2[9];
      local_40.Y = (double)plVar2[10];
      local_40.Z = (double)plVar2[0xb];
      type = ClassForSpawn(&local_44);
      mobj = AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
      if (mobj != (AActor *)0x0) {
        bVar8 = P_TestMobjLocation(mobj);
        if (bVar8) {
          if (plVar2[0x3b] != 0) {
            if ((*(byte *)(plVar2[0x3b] + 0x20) & 0x20) == 0) {
              other = (AActor *)plVar2[0x3b];
              if ((other != (AActor *)0x0) &&
                 (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                plVar2[0x3b] = 0;
                other = (AActor *)0x0;
              }
              AActor::CopyFriendliness(mobj,other,true,true);
              (mobj->master).field_0 =
                   *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(plVar2 + 0x3b);
            }
            else {
              plVar2[0x3b] = 0;
            }
          }
        }
        else {
          AActor::ClearCounters(mobj);
          (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
        }
      }
      (**(code **)(*plVar2 + 0x20))(plVar2);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b8ee5:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b8f10:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnBishop)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	mo = Spawn("Bishop", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (!P_TestMobjLocation(mo))
		{
			mo->ClearCounters();
			mo->Destroy ();
		}
		else if (self->target != NULL)
		{ // [RH] Make the new bishops inherit the Heriarch's target
			mo->CopyFriendliness (self->target, true);
			mo->master = self->target;
		}
	}
	self->Destroy ();
	return 0;
}